

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int fmt::internal::CharTraits<char>::format_float<double>
              (char *buffer,size_t size,char *format,uint width,int precision,double value)

{
  undefined4 local_40;
  undefined4 local_3c;
  double value_local;
  int precision_local;
  uint width_local;
  char *format_local;
  size_t size_local;
  char *buffer_local;
  
  if (width == 0) {
    if (precision < 0) {
      local_3c = snprintf(buffer,size,format,value);
    }
    else {
      local_3c = snprintf(buffer,size,format,value,(ulong)(uint)precision);
    }
    buffer_local._4_4_ = local_3c;
  }
  else {
    if (precision < 0) {
      local_40 = snprintf(buffer,size,format,value,(ulong)width);
    }
    else {
      local_40 = snprintf(buffer,size,format,value,(ulong)width,(ulong)(uint)precision);
    }
    buffer_local._4_4_ = local_40;
  }
  return buffer_local._4_4_;
}

Assistant:

int internal::CharTraits<char>::format_float(
    char *buffer, std::size_t size, const char *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SNPRINTF(buffer, size, format, value) :
        FMT_SNPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SNPRINTF(buffer, size, format, width, value) :
      FMT_SNPRINTF(buffer, size, format, width, precision, value);
}